

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

void ImDrawList_AddQuad(ImDrawList *self,ImVec2 a,ImVec2 b,ImVec2 c,ImVec2 d,ImU32 col,
                       float thickness)

{
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_20 = d;
  local_18 = c;
  local_10 = b;
  local_8 = a;
  ImDrawList::AddQuad(self,&local_8,&local_10,&local_18,&local_20,col,thickness);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddQuad (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImVec2 const *larg4, ImVec2 const *larg5, ImU32 *larg6, float larg7) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImVec2 arg4 ;
  ImVec2 arg5 ;
  ImU32 arg6 ;
  float arg7 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = *larg5;
  arg6 = *larg6;
  arg7 = larg7;
  try {
    ImDrawList_AddQuad(arg1,arg2,arg3,arg4,arg5,arg6,arg7);
    
  } catch (...) {
    
  }
}